

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O0

void __thiscall
dg::GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildCFG
          (GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *this,
          SubgraphInfo *subginfo)

{
  RWBBlock *pRVar1;
  bool bVar2;
  reference ppVar3;
  long in_RSI;
  SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock> SVar4;
  iterator succit;
  BasicBlock *succ;
  SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock> __end0_1;
  SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock> __begin0_1;
  const_succ_range *__range3;
  RWBBlock *bblock;
  BasicBlock *llvmblk;
  pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*> *it;
  iterator __end0;
  iterator __begin0;
  BlocksMappingT *__range2;
  SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock> *in_stack_ffffffffffffff38;
  iterator_range<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>_> *this_00;
  iterator_range<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>_> *this_01;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  RWBBlock *in_stack_ffffffffffffff98;
  ElemWithEdges<dg::dda::RWBBlock> *in_stack_ffffffffffffffa0;
  _Node_iterator_base<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_false> local_28
  ;
  _Node_iterator_base<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_false> local_20
  ;
  long local_18;
  
  local_18 = in_RSI + 8;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::BasicBlock_*,_dg::dda::RWBBlock_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>_>_>
       ::begin((unordered_map<const_llvm::BasicBlock_*,_dg::dda::RWBBlock_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>_>_>
                *)in_stack_ffffffffffffff38);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::BasicBlock_*,_dg::dda::RWBBlock_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>_>_>
       ::end((unordered_map<const_llvm::BasicBlock_*,_dg::dda::RWBBlock_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>_>_>
              *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar2 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar2) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_false,_false>
             ::operator*((_Node_iterator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_false,_false>
                          *)0x1ab850);
    pRVar1 = ppVar3->second;
    this_00 = (iterator_range<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>_>
               *)&stack0xffffffffffffff98;
    llvm::successors((BasicBlock *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    this_01 = this_00;
    SVar4 = llvm::
            iterator_range<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>_>::
            begin(this_00);
    in_stack_ffffffffffffff80 = SVar4.Idx;
    llvm::iterator_range<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>_>::end
              (this_00);
    while( true ) {
      bVar2 = llvm::
              iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
              ::operator!=((iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
                            *)this_01,in_stack_ffffffffffffff38);
      if (!bVar2) break;
      llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>::operator*
                ((SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock> *)0x1ab912);
      std::
      unordered_map<const_llvm::BasicBlock_*,_dg::dda::RWBBlock_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>_>_>
      ::find((unordered_map<const_llvm::BasicBlock_*,_dg::dda::RWBBlock_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>_>_>
              *)in_stack_ffffffffffffff38,(key_type *)0x1ab92d);
      in_stack_ffffffffffffff38 =
           (SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock> *)
           &(pRVar1->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
            super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>;
      std::__detail::
      _Node_iterator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_false,_false>
                  *)0x1ab94c);
      ElemWithEdges<dg::dda::RWBBlock>::addSuccessor
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      llvm::
      iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
      ::operator++((iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
                    *)0x1ab963);
    }
    std::__detail::
    _Node_iterator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_false,_false>
                *)this_01);
  }
  return;
}

Assistant:

void buildCFG(SubgraphInfo &subginfo) {
        for (auto &it : subginfo.blocks) {
            auto llvmblk = it.first;
            auto *bblock = it.second;

            for (auto *succ : successors(llvmblk)) {
                auto succit = subginfo.blocks.find(succ);
                assert((succit != subginfo.blocks.end()) &&
                       "Do not have the block built");

                bblock->addSuccessor(succit->second);
            }
        }
    }